

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O0

ExecutionResult __thiscall nigel::AST_Parser::onExecute(AST_Parser *this,CodeBase *base)

{
  bool bVar1;
  bool bVar2;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *this_00;
  __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *peVar3;
  shared_ptr<nigel::CompileNotification> *n;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *__range1;
  undefined1 local_68 [7];
  bool hasError;
  shared_ptr<nigel::AstExpr> expr;
  shared_ptr<nigel::AstBlock> local_48;
  shared_ptr<nigel::AstBlock> local_38;
  _Base_ptr local_28;
  CodeBase *local_20;
  CodeBase *base_local;
  AST_Parser *this_local;
  
  local_20 = base;
  base_local = (CodeBase *)this;
  local_28 = (_Base_ptr)
             std::__cxx11::
             list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
             begin(&base->lexerStruct);
  (this->currItr)._M_node = (_List_node_base *)local_28;
  this->base = local_20;
  std::make_shared<nigel::AstBlock>();
  std::shared_ptr<nigel::AstBlock>::operator=(&local_20->globalAst,&local_38);
  std::shared_ptr<nigel::AstBlock>::~shared_ptr(&local_38);
  std::shared_ptr<nigel::AstBlock>::shared_ptr(&local_48,&local_20->globalAst);
  fillSFR(this,&local_48);
  std::shared_ptr<nigel::AstBlock>::~shared_ptr(&local_48);
  std::
  stack<std::shared_ptr<nigel::AstBlock>,_std::deque<std::shared_ptr<nigel::AstBlock>,_std::allocator<std::shared_ptr<nigel::AstBlock>_>_>_>
  ::push(&this->blockStack,&local_20->globalAst);
  this->finishedParsing = false;
  while (((this->finishedParsing ^ 0xffU) & 1) != 0) {
    resolveNextExpr((AST_Parser *)local_68);
    std::shared_ptr<nigel::AstExpr>::~shared_ptr((shared_ptr<nigel::AstExpr> *)local_68);
  }
  bVar1 = false;
  this_00 = &(this->super_BuilderExecutable).notificationList;
  __end1 = std::__cxx11::
           list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
           ::begin(this_00);
  n = (shared_ptr<nigel::CompileNotification> *)
      std::__cxx11::
      list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
      ::end(this_00);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&n);
    if (!bVar2) {
LAB_001d9ae4:
      if ((local_20->printAST & 1U) != 0) {
        printAST(this,local_20);
      }
      if (bVar1) {
        this_local._4_4_ = astParsingFailed;
      }
      else {
        this_local._4_4_ = success;
      }
      return this_local._4_4_;
    }
    this_01 = (__shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::_List_iterator<std::shared_ptr<nigel::CompileNotification>_>::operator*
                           (&__end1);
    peVar3 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    if ((0 < (int)peVar3->type) &&
       (peVar3 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_01), (int)peVar3->type < 0x7fff)) {
      bVar1 = true;
      goto LAB_001d9ae4;
    }
    std::_List_iterator<std::shared_ptr<nigel::CompileNotification>_>::operator++(&__end1);
  } while( true );
}

Assistant:

ExecutionResult AST_Parser::onExecute( CodeBase &base )
	{
		//Set current iterator
		currItr = base.lexerStruct.begin();
		this->base = &base;

		base.globalAst = std::make_shared<AstBlock>();
		fillSFR( base.globalAst );
		blockStack.push( base.globalAst );

		finishedParsing = false;

		while( !finishedParsing )//Iterate the lexer
		{
			std::shared_ptr<AstExpr> expr = resolveNextExpr();
		}

		bool hasError = false;
		for( auto &n : notificationList ) if( n->type > NT::begin_err && n->type < NT::begin_warning )
		{
			hasError = true;
			break;
		}

		if( base.printAST ) printAST( base );

		if( hasError ) return ExecutionResult::astParsingFailed;
		else return ExecutionResult::success;
	}